

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O2

int __thiscall Fl_Text_Buffer::rewind_lines(Fl_Text_Buffer *this,int startPos,int nLines)

{
  long lVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (startPos < 2) {
    return 0;
  }
  uVar6 = (ulong)(uint)startPos;
  iVar3 = -1;
  do {
    iVar2 = (int)uVar6 + 1;
    uVar5 = uVar6;
    do {
      if ((long)uVar5 <= (long)this->mGapStart) {
        uVar5 = uVar5 & 0xffffffff;
        do {
          iVar2 = (int)uVar5;
          uVar4 = iVar2 - 1;
          uVar5 = (ulong)uVar4;
          if ((int)uVar4 < 0) {
            return 0;
          }
        } while ((this->mBuf[uVar4] != '\n') || (iVar3 = iVar3 + 1, iVar3 < nLines));
        return iVar2;
      }
      iVar2 = iVar2 + -1;
      uVar6 = uVar5 - 1;
      lVar1 = uVar5 + (long)(this->mGapEnd - this->mGapStart) + -1;
      uVar5 = uVar6;
    } while (this->mBuf[lVar1] != '\n');
    iVar3 = iVar3 + 1;
  } while (iVar3 < nLines);
  return iVar2;
}

Assistant:

int Fl_Text_Buffer::rewind_lines(int startPos, int nLines)
{
  IS_UTF8_ALIGNED2(this, (startPos))
  
  int pos = startPos - 1;
  if (pos <= 0)
    return 0;
  
  int gapLen = mGapEnd - mGapStart;
  int lineCount = -1;
  while (pos >= mGapStart) {
    if (mBuf[pos + gapLen] == '\n') {
      if (++lineCount >= nLines) {
        IS_UTF8_ALIGNED2(this, (pos+1))
	return pos + 1;
      }
    }
    pos--;
  }
  while (pos >= 0) {
    if (mBuf[pos] == '\n') {
      if (++lineCount >= nLines) {
        IS_UTF8_ALIGNED2(this, (pos+1))
	return pos + 1;
      }
    }
    pos--;
  }
  return 0;
}